

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_sort.cc
# Opt level: O1

void unique_sort_features(uint64_t parse_mask,example *ae)

{
  byte *pbVar1;
  bool bVar2;
  example *__range1;
  byte *pbVar3;
  features *this;
  
  pbVar1 = (ae->super_example_predict).indices._end;
  for (pbVar3 = (ae->super_example_predict).indices._begin; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    this = (ae->super_example_predict).feature_space + *pbVar3;
    bVar2 = features::sort(this,parse_mask);
    if (bVar2) {
      unique_features(this,-1);
    }
  }
  ae->sorted = true;
  return;
}

Assistant:

void unique_sort_features(uint64_t parse_mask, example* ae)
{
  for (features& fs : *ae)
    if (fs.sort(parse_mask))
      unique_features(fs);

  ae->sorted = true;
}